

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ggwave_ProtocolId gVar6;
  uint uVar7;
  ggwave_Parameters *pgVar8;
  undefined8 *puVar9;
  void *pvVar10;
  byte *pbVar11;
  Protocols *pPVar12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  byte *pbVar18;
  char *pcVar19;
  bool bVar20;
  string payload_1;
  TxRxData result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  anon_class_8_1_4eff857e addNoiseHelper;
  anon_class_8_1_4eff857e convertHelper;
  string payload;
  GGWave instance;
  
  bVar20 = true;
  if (1 < argc) {
    iVar3 = strcmp(argv[1],"--full");
    bVar20 = iVar3 != 0;
  }
  addNoiseHelper.buffer = &buffer;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  convertHelper.buffer = addNoiseHelper.buffer;
  pgVar8 = (ggwave_Parameters *)GGWave::getDefaultParameters();
  GGWave::GGWave(&instance,pgVar8);
  std::__cxx11::string::string((string *)&payload_1,"hello",(allocator *)&payload);
  cVar2 = GGWave::init((char *)&instance,(ggwave_ProtocolId)payload_1._M_dataplus._M_p,1);
  if (cVar2 == '\0') {
    pcVar19 = "instance.init(payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST)";
    uVar15 = 0xb9;
  }
  else {
    cVar2 = GGWave::init((int)&instance,(char *)0xffffffffffffffff,0x1091bb,1);
    if (cVar2 == '\0') {
      cVar2 = GGWave::init((int)&instance,(char *)0x0,GGWAVE_PROTOCOL_AUDIBLE_NORMAL,1);
      if (cVar2 == '\0') {
        pcVar19 = "instance.init(0, nullptr, GGWAVE_PROTOCOL_AUDIBLE_FAST)";
        uVar15 = 0xbd;
      }
      else {
        cVar2 = GGWave::init((int)&instance,(char *)0x0,0x1091bb,1);
        if (cVar2 == '\0') {
          pcVar19 = "instance.init(0, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST)";
          uVar15 = 0xbe;
        }
        else {
          cVar2 = GGWave::init((int)&instance,(char *)0x1,0x1091bb,1);
          if (cVar2 == '\0') {
            pcVar19 = "instance.init(1, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST)";
            uVar15 = 0xbf;
          }
          else {
            cVar2 = GGWave::init((int)&instance,(char *)0x2,0x1091bb,1);
            if (cVar2 == '\0') {
              pcVar19 = "instance.init(2, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST)";
              uVar15 = 0xc0;
            }
            else {
              cVar2 = GGWave::init((int)&instance,(char *)0x3,0x1091bb,1);
              if (cVar2 == '\0') {
                pcVar19 = "instance.init(3, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST)";
                uVar15 = 0xc1;
              }
              else {
                cVar2 = GGWave::init((int)&instance,
                                     (char *)(payload_1._M_string_length & 0xffffffff),
                                     (ggwave_ProtocolId)payload_1._M_dataplus._M_p,1);
                if (cVar2 == '\0') {
                  cVar2 = GGWave::init((int)&instance,
                                       (char *)(payload_1._M_string_length & 0xffffffff),
                                       (ggwave_ProtocolId)payload_1._M_dataplus._M_p,1);
                  if (cVar2 == '\0') {
                    pcVar19 = 
                    "instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 0)"
                    ;
                    uVar15 = 0xc5;
                  }
                  else {
                    cVar2 = GGWave::init((int)&instance,
                                         (char *)(payload_1._M_string_length & 0xffffffff),
                                         (ggwave_ProtocolId)payload_1._M_dataplus._M_p,1);
                    if (cVar2 == '\0') {
                      pcVar19 = 
                      "instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 50)"
                      ;
                      uVar15 = 0xc6;
                    }
                    else {
                      cVar2 = GGWave::init((int)&instance,
                                           (char *)(payload_1._M_string_length & 0xffffffff),
                                           (ggwave_ProtocolId)payload_1._M_dataplus._M_p,1);
                      if (cVar2 == '\0') {
                        pcVar19 = 
                        "instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 100)"
                        ;
                        uVar15 = 199;
                      }
                      else {
                        cVar2 = GGWave::init((int)&instance,
                                             (char *)(payload_1._M_string_length & 0xffffffff),
                                             (ggwave_ProtocolId)payload_1._M_dataplus._M_p,1);
                        if (cVar2 == '\0') {
                          std::__cxx11::string::~string((string *)&payload_1);
                          GGWave::~GGWave(&instance);
                          uVar16 = 8000;
                          while( true ) {
                            uVar7 = (uint)uVar16;
                            if (96000 < uVar7) {
                              std::__cxx11::string::string
                                        ((string *)&payload,"a0Z5kR2g",(allocator *)&instance);
                              p_Var14 = kFormats._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_left;
                              do {
                                p_Var13 = kFormats._M_t._M_impl.super__Rb_tree_header._M_header.
                                          _M_left;
                                if ((_Rb_tree_header *)p_Var14 ==
                                    &kFormats._M_t._M_impl.super__Rb_tree_header) {
                                  std::__cxx11::string::~string((string *)&payload);
                                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::
                                  ~_Vector_base(&buffer.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               );
                                  return 0;
                                }
                                for (; (_Rb_tree_header *)p_Var13 !=
                                       &kFormats._M_t._M_impl.super__Rb_tree_header;
                                    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)
                                    ) {
                                  if ((!bVar20) ||
                                     ((p_Var14[1]._M_color == 4 && (p_Var13[1]._M_color == 5)))) {
                                    for (lVar17 = 0; lVar17 != 0x16; lVar17 = lVar17 + 1) {
                                      pPVar12 = GGWave::Protocols::kDefault();
                                      if (pPVar12->data[lVar17].enabled != false) {
                                        printf("Testing: protocol = %s, in = %d, out = %d\n",
                                               pPVar12->data[lVar17].name,(ulong)p_Var13[1]._M_color
                                               ,(ulong)p_Var14[1]._M_color);
                                        pbVar11 = (byte *)0x1;
                                        while( true ) {
                                          iVar3 = (int)&instance;
                                          if (((long)(int)(uint)payload._M_string_length <
                                               (long)pbVar11) ||
                                             (pPVar12->data[lVar17].extra == '\x02')) break;
                                          puVar9 = (undefined8 *)GGWave::getDefaultParameters();
                                          payload_1._M_dataplus._M_p = (pointer)*puVar9;
                                          payload_1._M_string_length = puVar9[1];
                                          payload_1.field_2._M_allocated_capacity = puVar9[2];
                                          payload_1.field_2._12_4_ = p_Var14[1]._M_color;
                                          payload_1.field_2._8_4_ = p_Var13[1]._M_color;
                                          GGWave::GGWave(&instance,(ggwave_Parameters *)&payload_1);
                                          gVar6 = GGWave::rxProtocols();
                                          GGWave::Protocols::only(gVar6);
                                          GGWave::init(iVar3,(char *)((ulong)pbVar11 & 0xffffffff),
                                                       (ggwave_ProtocolId)payload._M_dataplus._M_p,
                                                       (int)lVar17);
                                          uVar7 = GGWave::encodeSize_bytes();
                                          uVar4 = GGWave::encode();
                                          printf("Expected = %d, actual = %d\n",(ulong)uVar7,
                                                 (ulong)uVar4);
                                          if (uVar7 != uVar4) {
                                            pcVar19 = "expectedSize == nBytes";
                                            uVar15 = 0x116;
                                            goto LAB_00104d5d;
                                          }
                                          pvVar10 = (void *)GGWave::txWaveform();
                                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::resize(&buffer,(ulong)uVar7);
                                          memcpy(buffer.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start,pvVar10,
                                                 (ulong)uVar7);
                                          main::anon_class_8_1_4eff857e::operator()
                                                    (&addNoiseHelper,0.02,payload_1.field_2._12_4_);
                                          main::anon_class_8_1_4eff857e::operator()
                                                    (&convertHelper,p_Var14[1]._M_color,
                                                     p_Var13[1]._M_color);
                                          GGWave::decode(&instance,
                                                         (uint)buffer.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          uVar7 = GGWave::rxTakeData((ggvector *)&instance);
                                          if (pbVar11 != (byte *)(ulong)uVar7) {
                                            pcVar19 = "instance.rxTakeData(result) == length";
                                            uVar15 = 0x11d;
                                            goto LAB_00104d5d;
                                          }
                                          pbVar18 = (byte *)0x0;
                                          while (pbVar11 != pbVar18) {
                                            pcVar19 = payload._M_dataplus._M_p + (long)pbVar18;
                                            bVar1 = *pbVar18;
                                            pbVar18 = pbVar18 + 1;
                                            if ((int)*pcVar19 != (uint)bVar1) {
                                              pcVar19 = "payload[i] == result[i]";
                                              uVar15 = 0x11f;
                                              goto LAB_00104d5d;
                                            }
                                          }
                                          GGWave::~GGWave(&instance);
                                          pbVar11 = pbVar11 + 1;
                                        }
                                        for (pbVar11 = (byte *)0x1;
                                            (long)pbVar11 <=
                                            (long)(int)(uint)payload._M_string_length;
                                            pbVar11 = pbVar11 + 1) {
                                          puVar9 = (undefined8 *)GGWave::getDefaultParameters();
                                          payload_1._M_string_length = puVar9[1];
                                          payload_1.field_2._M_allocated_capacity = puVar9[2];
                                          payload_1._M_dataplus._M_p._4_4_ =
                                               (float)((ulong)*puVar9 >> 0x20);
                                          payload_1._M_dataplus._M_p._0_4_ = (int)pbVar11;
                                          payload_1.field_2._12_4_ = p_Var14[1]._M_color;
                                          payload_1.field_2._8_4_ = p_Var13[1]._M_color;
                                          rand();
                                          GGWave::GGWave(&instance,(ggwave_Parameters *)&payload_1);
                                          gVar6 = GGWave::rxProtocols();
                                          GGWave::Protocols::only(gVar6);
                                          GGWave::init(iVar3,(char *)((ulong)pbVar11 & 0xffffffff),
                                                       (ggwave_ProtocolId)payload._M_dataplus._M_p,
                                                       (int)lVar17);
                                          uVar7 = GGWave::encodeSize_bytes();
                                          uVar4 = GGWave::encode();
                                          printf("Expected = %d, actual = %d\n",(ulong)uVar7,
                                                 (ulong)uVar4);
                                          if (uVar7 != uVar4) {
                                            pcVar19 = "expectedSize == nBytes";
                                            uVar15 = 0x133;
                                            goto LAB_00104d5d;
                                          }
                                          pvVar10 = (void *)GGWave::txWaveform();
                                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::resize(&buffer,(ulong)uVar7);
                                          memcpy(buffer.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start,pvVar10,
                                                 (ulong)uVar7);
                                          main::anon_class_8_1_4eff857e::operator()
                                                    (&addNoiseHelper,0.1,payload_1.field_2._12_4_);
                                          main::anon_class_8_1_4eff857e::operator()
                                                    (&convertHelper,p_Var14[1]._M_color,
                                                     p_Var13[1]._M_color);
                                          GGWave::decode(&instance,
                                                         (uint)buffer.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                          uVar7 = GGWave::rxTakeData((ggvector *)&instance);
                                          if (pbVar11 != (byte *)(ulong)uVar7) {
                                            pcVar19 = "instance.rxTakeData(result) == length";
                                            uVar15 = 0x13a;
                                            goto LAB_00104d5d;
                                          }
                                          pbVar18 = (byte *)0x0;
                                          while (pbVar11 != pbVar18) {
                                            pcVar19 = payload._M_dataplus._M_p + (long)pbVar18;
                                            bVar1 = *pbVar18;
                                            pbVar18 = pbVar18 + 1;
                                            if ((int)*pcVar19 != (uint)bVar1) {
                                              pcVar19 = "payload[i] == result[i]";
                                              uVar15 = 0x13c;
                                              goto LAB_00104d5d;
                                            }
                                          }
                                          GGWave::~GGWave(&instance);
                                        }
                                      }
                                    }
                                  }
                                }
                                p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
                              } while( true );
                            }
                            printf("Testing: sample rate = %d\n",uVar16);
                            puVar9 = (undefined8 *)GGWave::getDefaultParameters();
                            payload_1._M_dataplus._M_p = (pointer)*puVar9;
                            payload_1._M_string_length = puVar9[1];
                            payload_1.field_2._8_8_ = puVar9[3];
                            payload_1.field_2._M_allocated_capacity._0_4_ = (undefined4)puVar9[2];
                            payload_1.field_2._M_allocated_capacity._4_4_ = 0x40400000;
                            std::__cxx11::string::string
                                      ((string *)&payload,"hello123",(allocator *)&instance);
                            payload_1._M_string_length =
                                 CONCAT44(payload_1._M_string_length._4_4_,(float)(int)uVar7);
                            GGWave::GGWave(&instance,(ggwave_Parameters *)&payload_1);
                            GGWave::init((char *)&instance,
                                         (ggwave_ProtocolId)payload._M_dataplus._M_p,8);
                            uVar4 = GGWave::encodeSize_bytes();
                            uVar5 = GGWave::encode();
                            printf("Expected = %d, actual = %d\n",(ulong)uVar4,(ulong)uVar5);
                            if (uVar4 < uVar5) break;
                            pvVar10 = (void *)GGWave::txWaveform();
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&buffer,(ulong)uVar5);
                            memcpy(buffer.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,pvVar10,(ulong)uVar5);
                            main::anon_class_8_1_4eff857e::operator()
                                      (&addNoiseHelper,0.01,payload_1.field_2._12_4_);
                            main::anon_class_8_1_4eff857e::operator()
                                      (&convertHelper,payload_1.field_2._12_4_,
                                       payload_1.field_2._8_4_);
                            GGWave::~GGWave(&instance);
                            payload_1._M_dataplus._M_p._4_4_ = (float)(int)uVar7;
                            GGWave::GGWave(&instance,(ggwave_Parameters *)&payload_1);
                            gVar6 = GGWave::rxProtocols();
                            GGWave::Protocols::only(gVar6);
                            GGWave::decode(&instance,
                                           (uint)buffer.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
                            uVar4 = GGWave::rxTakeData((ggvector *)&instance);
                            if (uVar4 != (uint)payload._M_string_length) {
                              pcVar19 = "instanceInp.rxTakeData(result) == (int) payload.size()";
                              uVar15 = 0xec;
                              goto LAB_00104d5d;
                            }
                            pbVar11 = (byte *)(ulong)uVar4;
                            if ((int)uVar4 < 1) {
                              pbVar11 = (byte *)0x0;
                            }
                            pbVar18 = (byte *)0x0;
                            while (pbVar11 != pbVar18) {
                              pcVar19 = payload._M_dataplus._M_p + (long)pbVar18;
                              bVar1 = *pbVar18;
                              pbVar18 = pbVar18 + 1;
                              if ((int)*pcVar19 != (uint)bVar1) {
                                pcVar19 = "payload[i] == result[i]";
                                uVar15 = 0xee;
                                goto LAB_00104d5d;
                              }
                            }
                            GGWave::~GGWave(&instance);
                            std::__cxx11::string::~string((string *)&payload);
                            uVar16 = (ulong)(uVar7 + 0x55b);
                          }
                          pcVar19 = "expectedSize >= nBytes";
                          uVar15 = 0xdd;
                        }
                        else {
                          pcVar19 = 
                          "!(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 101))"
                          ;
                          uVar15 = 200;
                        }
                      }
                    }
                  }
                }
                else {
                  pcVar19 = 
                  "!(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, -1))"
                  ;
                  uVar15 = 0xc4;
                }
              }
            }
          }
        }
      }
    }
    else {
      pcVar19 = "!(instance.init(-1, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST))";
      uVar15 = 0xbc;
    }
  }
LAB_00104d5d:
  fprintf(_stderr,"[%s:%d] Check failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
          ,uVar15,pcVar19);
  exit(1);
}

Assistant:

int main(int argc, char ** argv) {
    bool full = false;
    if (argc > 1) {
        if (strcmp(argv[1], "--full") == 0) {
            full = true;
        }
    }

    std::vector<uint8_t> buffer;

    auto convertHelper = [&](GGWave::SampleFormat formatOut, GGWave::SampleFormat formatInp) {
        switch (formatOut) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<uint8_t, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<uint8_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<uint8_t, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<uint8_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<int8_t, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<int8_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<int8_t, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<int8_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<uint16_t, uint8_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<uint16_t, int8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<uint16_t, int16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<uint16_t, float>  (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<int16_t, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<int16_t, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<int16_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<int16_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<float, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<float, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<float, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<float, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       break;
                    };
                } break;
        };
    };

    auto addNoiseHelper = [&](float level, GGWave::SampleFormat format) {
        switch (format) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    const int n = buffer.size()/sizeof(uint8_t);
                    auto p = (uint8_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(0.0f, std::min(255.0f, (float) p[i] + (frand() - 0.5f)*(level*256)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    const int n = buffer.size()/sizeof(int8_t);
                    auto p = (int8_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-128.0f, std::min(127.0f, (float) p[i] + (frand() - 0.5f)*(level*256)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    const int n = buffer.size()/sizeof(uint16_t);
                    auto p = (uint16_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(0.0f, std::min(65535.0f, (float) p[i] + (frand() - 0.5f)*(level*65536)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    const int n = buffer.size()/sizeof(int16_t);
                    auto p = (int16_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-32768.0f, std::min(32767.0f, (float) p[i] + (frand() - 0.5f)*(level*65536)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    const int n = buffer.size()/sizeof(float);
                    auto p = (float *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-1.0f, std::min(1.0f, p[i] + (frand() - 0.5f)*(level)));
                    }
                } break;
        };
    };

    {
        GGWave instance(GGWave::getDefaultParameters());

        std::string payload = "hello";

        CHECK(instance.init(payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST));

        // data
        CHECK_F(instance.init(-1, "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(0,  nullptr, GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(0,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(1,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(2,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(3,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));

        // volume
        CHECK_F(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, -1));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 0));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 50));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 100));
        CHECK_F(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 101));
    }

    // playback / capture at different sample rates
    for (int srInp = GGWave::kDefaultSampleRate/6; srInp <= 2*GGWave::kDefaultSampleRate; srInp += 1371) {
        printf("Testing: sample rate = %d\n", srInp);

        auto parameters = GGWave::getDefaultParameters();
        parameters.soundMarkerThreshold = 3.0f;

        const std::string payload = "hello123";

        // encode
        {
            parameters.sampleRateOut = srInp;
            GGWave instanceOut(parameters);

            instanceOut.init(payload.c_str(), GGWAVE_PROTOCOL_DT_FASTEST, 25);
            const auto expectedSize = instanceOut.encodeSize_bytes();
            const auto nBytes = instanceOut.encode();
            printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
            CHECK(expectedSize >= nBytes);
            { auto p = (const uint8_t *)(instanceOut.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
            addNoiseHelper(0.01, parameters.sampleFormatOut); // add some artificial noise
            convertHelper(parameters.sampleFormatOut, parameters.sampleFormatInp);
        }

        // decode
        {
            parameters.sampleRateInp = srInp;
            GGWave instanceInp(parameters);
            instanceInp.rxProtocols().only(GGWAVE_PROTOCOL_DT_FASTEST);

            instanceInp.decode(buffer.data(), buffer.size());

            GGWave::TxRxData result;
            CHECK(instanceInp.rxTakeData(result) == (int) payload.size());
            for (int i = 0; i < (int) payload.size(); ++i) {
                CHECK(payload[i] == result[i]);
            }
        }
    }

    const std::string payload = "a0Z5kR2g";

    // encode / decode using different sample formats and Tx protocols
    for (const auto & formatOut : kFormats) {
        for (const auto & formatInp : kFormats) {
            if (full == false) {
                if (formatOut != GGWAVE_SAMPLE_FORMAT_I16) continue;
                if (formatInp != GGWAVE_SAMPLE_FORMAT_F32) continue;
            }
            for (int protocolId = 0; protocolId < GGWAVE_PROTOCOL_COUNT; ++protocolId) {
                const auto & protocol = GGWave::Protocols::kDefault()[protocolId];
                if (protocol.enabled == false) continue;
                printf("Testing: protocol = %s, in = %d, out = %d\n", protocol.name, formatInp, formatOut);

                for (int length = 1; length <= (int) payload.size(); ++length) {
                    // mono-tone protocols with variable length are not supported
                    if (protocol.extra == 2) {
                        break;
                    }

                    // variable payload length
                    {
                        auto parameters = GGWave::getDefaultParameters();
                        parameters.sampleFormatInp = formatInp;
                        parameters.sampleFormatOut = formatOut;
                        // it seems DSS is not suitable for "variable-length" transmission
                        // sometimes, the decoder incorrectly detects an early "end" marker when DSS is enabled
                        //if (rand() % 2 == 0) parameters.operatingMode |= GGWAVE_OPERATING_MODE_USE_DSS;
                        GGWave instance(parameters);
                        instance.rxProtocols().only(GGWave::ProtocolId(protocolId));

                        instance.init(length, payload.data(), GGWave::ProtocolId(protocolId), 25);
                        const auto expectedSize = instance.encodeSize_bytes();
                        const auto nBytes = instance.encode();
                        printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
                        CHECK(expectedSize == nBytes);
                        { auto p = (const uint8_t *)(instance.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
                        addNoiseHelper(0.02, parameters.sampleFormatOut); // add some artificial noise
                        convertHelper(formatOut, formatInp);
                        instance.decode(buffer.data(), buffer.size());

                        GGWave::TxRxData result;
                        CHECK(instance.rxTakeData(result) == length);
                        for (int i = 0; i < length; ++i) {
                            CHECK(payload[i] == result[i]);
                        }
                    }
                }

                for (int length = 1; length <= (int) payload.size(); ++length) {
                    // fixed payload length
                    {
                        auto parameters = GGWave::getDefaultParameters();
                        parameters.payloadLength = length;
                        parameters.sampleFormatInp = formatInp;
                        parameters.sampleFormatOut = formatOut;
                        if (rand() % 2 == 0) parameters.operatingMode |= GGWAVE_OPERATING_MODE_USE_DSS;
                        GGWave instance(parameters);
                        instance.rxProtocols().only(GGWave::ProtocolId(protocolId));

                        instance.init(length, payload.data(), GGWave::ProtocolId(protocolId), 10);
                        const auto expectedSize = instance.encodeSize_bytes();
                        const auto nBytes = instance.encode();
                        printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
                        CHECK(expectedSize == nBytes);
                        { auto p = (const uint8_t *)(instance.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
                        addNoiseHelper(0.10, parameters.sampleFormatOut); // add some artificial noise
                        convertHelper(formatOut, formatInp);
                        instance.decode(buffer.data(), buffer.size());

                        GGWave::TxRxData result;
                        CHECK(instance.rxTakeData(result) == length);
                        for (int i = 0; i < length; ++i) {
                            CHECK(payload[i] == result[i]);
                        }
                    }
                }
            }
        }
    }

    return 0;
}